

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

int set_representative_proc(Am_Object *self)

{
  int iVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Object AVar4;
  ushort uVar5;
  Am_Object example;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Value_List l;
  Am_String class_name;
  
  uVar5 = (ushort)self;
  pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)(ushort)CLASS_NAME);
  Am_String::Am_String(&class_name,pAVar3);
  example.data = (Am_Object_Data *)0x0;
  pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)(ushort)CLASS_EXAMPLES);
  Am_Value_List::Am_Value_List(&l,pAVar3);
  Am_Value_List::Start();
  cVar2 = Am_Value_List::Last();
  if (cVar2 == '\0') {
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::Am_Object(&local_38,pAVar3);
    Am_Object::Copy((char *)&local_30);
    Am_Object::operator=(&example,&local_30);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_38);
  }
  Am_Object::Remove_Part(uVar5);
  iVar1 = CLASS_REPRESENTATIVE;
  Am_Object::Am_Object(&local_40,&example);
  AVar4.data._0_4_ = iVar1 & 0xffff;
  AVar4.data._4_4_ = 0;
  Am_Object::Add_Part(uVar5,AVar4,(ulong)&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List(&l);
  Am_Object::~Am_Object(&example);
  Am_String::~Am_String(&class_name);
  return 1;
}

Assistant:

Am_Define_Formula(int, set_representative)
{
  Am_String class_name = self.Get(CLASS_NAME);
  //   Am_Value_List l = trainer.Get_Examples (class_name);
  //   Am_Object example;

  //   l.Start ();
  //   if (!l.Last())
  //     example = Example_Create (l.Get());

  Am_Object example;
  Am_Value_List l = self.Get(CLASS_EXAMPLES);
  l.Start();
  if (!l.Last())
    example = Am_Object(l.Get()).Copy();

  self.Remove_Part(CLASS_REPRESENTATIVE);
  self.Add_Part(CLASS_REPRESENTATIVE, example);
  //  cout << "Class " << self << " represented by " << example << endl;
  return 1;
}